

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2ce591::TransformSelector::~TransformSelector(TransformSelector *this)

{
  code *pcVar1;
  TransformSelector *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~TransformSelector() = default;